

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O2

int dodip(obj *potion)

{
  bool bVar1;
  boolean bVar2;
  char cVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  obj *poVar8;
  char *pcVar9;
  char *pcVar10;
  obj *poVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  short sVar15;
  int iVar16;
  int y;
  ushort uVar17;
  obj **ppot2;
  char *pcVar18;
  obj *poVar19;
  bool bVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  obj *local_430;
  obj *local_428;
  short local_41c;
  char allowall [2];
  char qbuf [128];
  char buf [256];
  char Your_buf [256];
  char newbuf [256];
  obj local_98;
  
  bVar21 = 0;
  allowall[0] = '\x14';
  allowall[1] = '\0';
  if ((potion != (obj *)0x0) && (bVar2 = validate_object(potion,"\b","dip into"), bVar2 == '\0')) {
    return 0;
  }
  poVar8 = getobj(allowall,"dip",(obj **)0x0);
  if (poVar8 == (obj *)0x0) {
    return 0;
  }
  if (potion == (obj *)0x0) {
    if (level->locations[u.ux][u.uy].typ == '\x1c') {
      pcVar9 = xname(poVar8);
      pcVar9 = the(pcVar9);
      pcVar10 = simple_typename((int)poVar8->otyp);
      pcVar10 = the(pcVar10);
      pcVar9 = safe_qbuf("",0x18,pcVar9,pcVar10,"this item");
      sprintf(qbuf,"Dip %s into the fountain?",pcVar9);
      cVar3 = yn_function(qbuf,"yn",'n');
      if (cVar3 == 'y') {
        dipfountain(poVar8);
        return 1;
      }
    }
    else {
      bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
      if ((bVar2 != '\0') || (bVar2 = is_swamp(level,(int)u.ux,(int)u.uy), bVar2 != '\0')) {
        pcVar9 = waterbody_name(u.ux,u.uy);
        pcVar10 = xname(poVar8);
        pcVar10 = the(pcVar10);
        pcVar18 = simple_typename((int)poVar8->otyp);
        pcVar18 = the(pcVar18);
        pcVar10 = safe_qbuf("",0x1d,pcVar10,pcVar18,"this item");
        sprintf(qbuf,"Dip %s into the %s?",pcVar10,pcVar9);
        cVar3 = yn_function(qbuf,"yn",'n');
        if (cVar3 == 'y') {
          if ((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
             ((youmonst.data)->mlet == '\x05')) {
            floating_above(pcVar9);
            return 1;
          }
          if (((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 2) == 0)) &&
             (u.weapon_skills[0x27].skill < '\x02')) {
            rider_cant_reach();
            return 1;
          }
          get_wet(poVar8);
          if (poVar8->otyp != 0x141) {
            return 1;
          }
          goto LAB_0021379e;
        }
      }
    }
    pcVar9 = xname(poVar8);
    pcVar9 = the(pcVar9);
    pcVar10 = simple_typename((int)poVar8->otyp);
    pcVar10 = the(pcVar10);
    pcVar9 = safe_qbuf("",10,pcVar9,pcVar10,"this item");
    sprintf(qbuf,"dip %s into",pcVar9);
    potion = getobj("\b",qbuf,(obj **)0x0);
    if (potion == (obj *)0x0) {
      return 0;
    }
  }
  if ((potion == poVar8) && (potion->quan == 1)) {
    pline("That is a potion bottle, not a Klein bottle!");
    return 0;
  }
  uVar12 = *(uint *)&potion->field_0x4a;
  uVar5 = uVar12 | 0x800000;
  *(uint *)&potion->field_0x4a = uVar5;
  sVar4 = potion->otyp;
  local_430 = poVar8;
  local_428 = potion;
  if ((long)sVar4 != 0x14f) {
    sVar15 = poVar8->otyp;
    if (sVar4 == 0x13a || (long)sVar15 == 0x13a) {
      ppot2 = &local_430;
      iVar7 = dip_diluted_same_potions(&local_428,ppot2);
      if (iVar7 != 0) {
        *(uint *)&local_428->field_0x4a = *(uint *)&local_428->field_0x4a & 0xff7fffff;
        poVar8 = local_428;
        goto LAB_00212cd8;
      }
      uVar17 = local_430->otyp;
      auVar22 = pshuflw(ZEXT216(uVar17),ZEXT216(uVar17),0);
      auVar23._0_2_ = -(ushort)(auVar22._0_2_ == 0x1c9);
      auVar23._2_2_ = -(ushort)(auVar22._0_2_ == 0x1c9);
      auVar23._4_2_ = -(ushort)(auVar22._2_2_ == local_428->otyp);
      auVar23._6_2_ = -(ushort)(auVar22._2_2_ == local_428->otyp);
      auVar23._8_2_ = -(ushort)(auVar22._4_2_ == 0x19e);
      auVar23._10_2_ = -(ushort)(auVar22._4_2_ == 0x19e);
      auVar23._12_2_ = -(ushort)(auVar22._6_2_ == 0xcf);
      auVar23._14_2_ = -(ushort)(auVar22._6_2_ == 0xcf);
      iVar7 = movmskps((int)ppot2,auVar23);
      if (((iVar7 == 0) && (local_430 != uball)) && (local_430 != uskin)) {
        poVar8 = local_430;
        if (uVar17 == 0x13a) {
          poVar8 = local_428;
        }
        bVar2 = obj_resists(poVar8,5,0x5f);
        poVar11 = local_430;
        poVar8 = uwep;
        if (bVar2 == '\0') {
          sVar4 = local_430->otyp;
          u.uconduct.polypiles = u.uconduct.polypiles + 1;
          bVar20 = true;
          if (local_430 == uwep) {
LAB_0021323f:
            bVar1 = true;
          }
          else {
            if (local_430 != uswapwep) {
              bVar20 = local_430 != uquiver;
              goto LAB_0021323f;
            }
            bVar1 = false;
          }
          local_430 = poly_obj(local_430,0);
          if (poVar11 == poVar8) {
            setuwep(local_430);
          }
          else if (bVar1) {
            if (!bVar20) {
              setuqwep(local_430);
            }
          }
          else {
            setuswapwep(local_430);
          }
          if (local_430->otyp != sVar4) {
            discover_object(0x13a,'\x01','\x01');
            useup(local_428);
            poVar8 = local_430;
LAB_00212cd8:
            prinv((char *)0x0,poVar8,0);
            return 1;
          }
          pline("Nothing seems to happen.");
          goto LAB_00212f65;
        }
      }
      pline("Nothing happens.");
LAB_00212f06:
      *(uint *)&local_428->field_0x4a = *(uint *)&local_428->field_0x4a & 0xff7fffff;
      return 1;
    }
    if ((sVar15 == sVar4) || (poVar8->oclass != '\b')) {
      iVar7 = dip_diluted_same_potions(&local_428,&local_430);
      if (iVar7 != 0) {
        local_428->field_0x4c = local_428->field_0x4c & 0x7f;
        poVar8 = local_428;
        goto LAB_00212cd8;
      }
      goto LAB_00212d69;
    }
    if (((uVar12 & 0x20) == 0) || ((poVar8->field_0x4a & 0x20) == 0)) {
      pline("The potions mix...");
    }
    else {
      pline("You mix the %s potion with the %s one ...",
            obj_descr[objects[sVar4].oc_descr_idx].oc_descr,
            obj_descr[objects[sVar15].oc_descr_idx].oc_descr);
    }
    if (((((poVar8->field_0x4a & 1) != 0) || (poVar8->otyp == 0x141)) || (potion->otyp == 0x141)) ||
       (uVar12 = mt_random(), uVar12 % 10 == 0)) {
      pline("BOOM!  They explode!");
      exercise(0,'\0');
      if ((~(youmonst.data)->mflags1 & 0x1400) != 0) {
        potionbreathe(poVar8);
      }
      useup(poVar8);
      useup(potion);
      bVar20 = (youmonst.mintrinsics & 0x40) == 0 && u.uprops[7].extrinsic == 0;
      iVar7 = rnd((uint)bVar20 + (uint)bVar20 * 4 + 5);
      losehp(iVar7,"alchemic blast",0);
      return 1;
    }
    uVar12 = *(uint *)&poVar8->field_0x4a & 0xffffffbc;
    *(uint *)&poVar8->field_0x4a = uVar12;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00213076;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0021306d;
LAB_00213931:
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum != u.umonster) {
          bVar2 = dmgtype(youmonst.data,0x24);
          if (bVar2 != '\0') goto LAB_00213977;
          uVar12 = *(uint *)&poVar8->field_0x4a;
        }
        goto LAB_00213970;
      }
    }
    else {
LAB_0021306d:
      if (ublindf != (obj *)0x0) {
LAB_00213076:
        if (ublindf->oartifact == '\x1d') goto LAB_00213931;
      }
LAB_00213970:
      *(uint *)&poVar8->field_0x4a = uVar12 & 0xffffffdf;
    }
LAB_00213977:
    sVar4 = mixtype(poVar8,potion);
    if (sVar4 == 0) {
      if ((poVar8->field_0x4b & 3) == 0) {
        iVar7 = rnd(8);
        if (iVar7 - 2U < 2) {
          poVar8->otyp = 0x13f;
          sVar4 = 0x13f;
        }
        else {
          if (iVar7 != 4) {
            if (iVar7 == 1) goto LAB_00213999;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00213be5;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00213bdc;
LAB_00213d67:
              pline("The mixture glows brightly and evaporates.");
            }
            else {
LAB_00213bdc:
              if (ublindf != (obj *)0x0) {
LAB_00213be5:
                if (ublindf->oartifact == '\x1d') goto LAB_00213d67;
              }
            }
            useup(poVar8);
            poVar8 = potion;
            goto LAB_0021379e;
          }
          poVar11 = mkobj(level,'\b','\0');
          poVar8->otyp = poVar11->otyp;
          obfree(poVar11,(obj *)0x0);
          sVar4 = poVar8->otyp;
        }
      }
      else {
LAB_00213999:
        poVar8->otyp = 0x14f;
        sVar4 = 0x14f;
      }
    }
    else {
      poVar8->otyp = sVar4;
    }
    *(uint *)&poVar8->field_0x4a =
         *(uint *)&poVar8->field_0x4a & 0xfffffcff | (uint)(sVar4 != 0x14f) << 8;
    if ((sVar4 == 0x14f) &&
       (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
        ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00213a1a;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00213a11;
        pcVar9 = ", then clears";
      }
      else {
LAB_00213a11:
        if (ublindf == (obj *)0x0) {
          pcVar9 = "";
        }
        else {
LAB_00213a1a:
          pcVar9 = "";
          if (ublindf->oartifact == '\x1d') {
            pcVar9 = ", then clears";
          }
        }
      }
      pcVar10 = "The mixture bubbles%s.";
    }
    else {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00213a4f;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00213a46;
      }
      else {
LAB_00213a46:
        if (ublindf == (obj *)0x0) goto LAB_00213ca4;
LAB_00213a4f:
        if (ublindf->oartifact != '\x1d') goto LAB_00213ca4;
      }
      pcVar9 = hcolor(obj_descr[objects[poVar8->otyp].oc_descr_idx].oc_descr);
      pcVar10 = "The mixture looks %s.";
    }
    pline(pcVar10,pcVar9);
LAB_00213ca4:
    useup(potion);
    poVar8->quan = poVar8->quan + 1;
    uVar12 = weight(poVar8);
    poVar8->owt = uVar12;
    return 1;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0021290f;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00212906;
LAB_00212bde:
    Shk_Your(Your_buf,poVar8);
    uVar5 = *(uint *)&local_428->field_0x4a;
    bVar20 = false;
  }
  else {
LAB_00212906:
    if (ublindf == (obj *)0x0) {
      bVar20 = true;
    }
    else {
LAB_0021290f:
      bVar20 = true;
      if (ublindf->oartifact == '\x1d') goto LAB_00212bde;
    }
  }
  if ((uVar5 & 2) == 0) {
    if ((uVar5 & 1) != 0) {
      if ((*(uint *)&local_430->field_0x4a & 2) == 0) {
        if ((*(uint *)&local_430->field_0x4a & 1) != 0) goto LAB_00212d69;
        if (!bVar20) {
          pcVar9 = hcolor("black");
          pcVar10 = aobjnam(local_430,"glow");
          pcVar18 = strchr("aeiouAEIOU",(int)*pcVar9);
          pcVar13 = "n";
          if (pcVar18 == (char *)0x0) {
            pcVar13 = "";
          }
          pline("%s %s with a%s %s aura.",Your_buf,pcVar10,pcVar13,pcVar9);
        }
        curse(local_430);
      }
      else {
        if (!bVar20) {
          pcVar9 = aobjnam(local_430,"glow");
          pcVar10 = hcolor("brown");
          pline("%s %s %s.",Your_buf,pcVar9,pcVar10);
        }
        unbless(local_430);
      }
      goto LAB_00212f5c;
    }
    bVar2 = get_wet(local_430);
    if (bVar2 == '\0') {
LAB_00212d69:
      sVar4 = local_428->otyp;
      if (((sVar4 == 0x141) && (local_430->otyp == 0x10e)) && (local_430->corpsenm == 0xa3)) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00212dae;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00212da9;
LAB_0021350a:
          pcVar9 = cxname(local_430);
          pcVar9 = The(pcVar9);
          pcVar10 = otense(local_430,"turn");
          pcVar18 = "orange";
          if ((*(ushort *)&local_428->field_0x4a & 0x300) == 0) {
            pcVar18 = "red";
          }
          pline("%s %s %s around the edges.",pcVar9,pcVar10,pcVar18);
          goto LAB_00212f06;
        }
LAB_00212da9:
        if (ublindf != (obj *)0x0) {
LAB_00212dae:
          if (ublindf->oartifact == '\x1d') goto LAB_0021350a;
        }
      }
      cVar3 = local_430->oclass;
      if ((cVar3 != '\x02') || (4 < (byte)(objects[local_430->otyp].oc_subtyp + 0x1aU))) {
LAB_00213131:
        if (sVar4 == 0x142) {
LAB_0021313d:
          uVar12 = *(uint *)&local_428->field_0x4a;
          if ((uVar12 >> 0x13 & 1) == 0) {
            if ((uVar12 & 1) == 0) {
              if (cVar3 != '\x02') {
                if (cVar3 == '\x06') {
                  uVar17 = local_430->otyp;
                  lVar14 = (long)(short)uVar17;
                  if (objects[lVar14].oc_subtyp != '\0') goto LAB_0021366f;
                }
                else {
                  uVar17 = local_430->otyp;
                }
                if ((uVar17 & 0xfffe) == 0xe8) {
                  if ((local_430->field_0x4c & 8) != 0) {
                    useup(local_428);
                    iVar16 = (int)u.ux;
                    y = (int)u.uy;
                    iVar7 = dice(6,6);
                    explode(iVar16,y,0xb,iVar7,'\0',5);
                    exercise(2,'\0');
                    return 1;
                  }
                  if ((uVar17 == 0xe9) && (local_430->spe == '\0')) {
                    local_430->otyp = 0xe8;
                    local_430->age = 0;
                  }
                  if (local_430->age < 0x3e9) {
                    pcVar9 = yname(local_430);
                    pline("You fill %s with oil.",pcVar9);
                    check_unpaid(local_428);
                    iVar7 = local_428->age * 2 + local_430->age;
                    if (0x5db < iVar7) {
                      iVar7 = 0x5dc;
                    }
                    local_430->age = iVar7;
                    useup(local_428);
                    exercise(2,'\x01');
                  }
                  else {
                    pcVar9 = Yname2(local_430);
                    pcVar10 = otense(local_430,"are");
                    pline("%s %s full.",pcVar9,pcVar10);
                    *(uint *)&local_428->field_0x4a = *(uint *)&local_428->field_0x4a & 0xff7fffff;
                  }
                  discover_object(0x142,'\x01','\x01');
                  local_430->spe = '\x01';
                  goto LAB_00213656;
                }
                goto LAB_002132e5;
              }
              lVar14 = (long)local_430->otyp;
LAB_0021366f:
              uVar17 = *(ushort *)&objects[lVar14].field_0x11 >> 4 & 0x1f;
              if (((uVar17 != 0xd) && (uVar17 != 0xb)) ||
                 (((cVar3 == '\x02' && ((byte)(objects[lVar14].oc_subtyp + 0x18U) < 3)) ||
                  ((local_430->field_0x4b & 0xf) == 0)))) {
                pcVar9 = Yname2(local_430);
                pcVar10 = otense(local_430,"gleam");
                pcVar18 = "%s %s with an oily sheen.";
                goto LAB_0021376a;
              }
              pcVar9 = Yname2(local_430);
              pcVar10 = otense(local_430,"are");
              pcVar18 = "corroded and rusty";
              if ((*(uint *)&local_430->field_0x4a & 0xc00) == 0) {
                pcVar18 = "rusty";
              }
              pcVar13 = "corroded";
              if ((*(uint *)&local_430->field_0x4a & 0x300) != 0) {
                pcVar13 = pcVar18;
              }
              pline("%s %s less %s.",pcVar9,pcVar10,pcVar13);
              uVar12 = *(uint *)&local_430->field_0x4a;
              if ((uVar12 & 0x300) != 0) {
                uVar12 = uVar12 & 0xfffffcff | uVar12 + 0x300 & 0x300;
                *(uint *)&local_430->field_0x4a = uVar12;
              }
              bVar2 = '\x01';
              if ((uVar12 & 0xc00) != 0) {
                *(uint *)&local_430->field_0x4a = uVar12 & 0xfffff3ff | uVar12 + 0xc00 & 0xc00;
              }
            }
            else {
              pcVar9 = body_part(3);
              pcVar9 = makeplural(pcVar9);
              bVar2 = '\0';
              pline("The potion spills and covers your %s with oil.",pcVar9);
              iVar7 = dice(2,10);
              incr_itimeout(&u.uprops[0x29].intrinsic,(long)iVar7);
            }
          }
          else {
            uVar17 = *(ushort *)&objects[local_430->otyp].field_0x11;
            bVar2 = catch_lit(local_430);
            if (bVar2 == '\0') {
              if (((((local_430->field_0x4b & 0x10) != 0) ||
                   (bVar2 = obj_resists(local_430,5,0x5f), bVar2 != '\0')) ||
                  (bVar2 = is_flammable(local_430), bVar2 == '\0')) || (local_430->oclass == '\a'))
              {
                pcVar9 = Yname2(local_430);
                pcVar10 = otense(local_430,"seem");
                pcVar18 = "%s %s to burn for a moment.";
LAB_0021376a:
                bVar2 = '\0';
                pline(pcVar18,pcVar9,pcVar10);
                goto LAB_0021377a;
              }
              uVar17 = uVar17 >> 4 & 0x1f;
              if (((uVar17 == 0x12) || (uVar17 == 5)) && (local_430->oartifact == '\0')) {
                local_430->field_0x4b = local_430->field_0x4b | 3;
              }
              pcVar9 = "damages";
              if ((~*(uint *)&local_430->field_0x4a & 0x300) == 0) {
                pcVar9 = "destroys";
              }
              pcVar10 = yname(local_430);
              pline("The burning oil %s %s.",pcVar9,pcVar10);
              uVar12 = *(uint *)&local_430->field_0x4a;
              if ((~uVar12 & 0x300) == 0) {
                obj_extract_self(local_430);
                bVar2 = '\0';
                obfree(local_430,(obj *)0x0);
                local_430 = (obj *)0x0;
                goto LAB_0021377a;
              }
              if ((uVar12 & 4) != 0) {
                verbalize("You burnt it, you bought it!");
                bill_dummy_object(local_430);
                uVar12 = *(uint *)&local_430->field_0x4a;
              }
              *(uint *)&local_430->field_0x4a = uVar12 & 0xfffffcff | uVar12 + 0x100 & 0x300;
            }
            bVar2 = '\0';
          }
LAB_0021377a:
          exercise(2,bVar2);
          discover_object((int)local_428->otyp,'\x01','\x01');
          poVar8 = local_428;
          goto LAB_0021379e;
        }
LAB_002132e2:
        uVar12 = *(uint *)&local_428->field_0x4a;
LAB_002132e5:
        *(uint *)&local_428->field_0x4a = uVar12 & 0xff7fffff;
        if (((local_430->otyp != 0x200) && (local_430->otyp != 0x10a)) ||
           (sVar4 = mixtype(local_430,local_428), sVar4 == 0)) {
          pline("Interesting...");
          return 1;
        }
        sVar15 = local_428->otyp;
        iVar7 = local_428->quan;
        buf[0] = '\0';
        uVar12 = *(uint *)&local_428->field_0x4a;
        iVar16 = iVar7;
        local_41c = sVar15;
        if ((uVar12 & 0x20) != 0) {
          pcVar9 = hcolor(obj_descr[objects[sVar15].oc_descr_idx].oc_descr);
          sprintf(buf,"%s ",pcVar9);
          iVar16 = local_428->quan;
        }
        poVar8 = local_428;
        if (1 < iVar16) {
          poVar8 = splitobj(local_428,1);
        }
        if (((poVar8->field_0x4a & 4) != 0) && (bVar2 = costly_spot(u.ux,u.uy), bVar2 != '\0')) {
          pline("You use it, you pay for it.");
          bill_dummy_object(poVar8);
        }
        poVar8->otyp = sVar4;
        uVar5 = *(uint *)&poVar8->field_0x4a;
        *(uint *)&poVar8->field_0x4a = uVar5 & 0xfffffffd;
        if (sVar4 == 0x14f) {
          uVar5 = uVar5 & 0xfffffcfc;
        }
        else {
          uVar5 = uVar5 & 0xfffffffc | *(uint *)&local_430->field_0x4a & 1;
        }
        uVar6 = uVar5 & 0xffffffbf;
        *(uint *)&poVar8->field_0x4a = uVar6;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0021343a;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00213435;
LAB_00213469:
          uVar5 = 0x20;
          if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
             (uVar5 = 0, u.umonnum != u.umonster)) {
            bVar2 = dmgtype(youmonst.data,0x24);
            uVar5 = (uint)(bVar2 != '\0') << 5;
            uVar6 = *(uint *)&poVar8->field_0x4a;
          }
          *(uint *)&poVar8->field_0x4a = uVar6 & 0xffffffdf | uVar5;
          if ((sVar4 == 0x14f) && (uVar5 != 0)) {
            builtin_strncpy(newbuf,"clears",7);
          }
          else {
            pcVar9 = hcolor(obj_descr[objects[sVar4].oc_descr_idx].oc_descr);
            sprintf(newbuf,"turns %s",pcVar9);
          }
          pcVar9 = "";
          if (1 < iVar7) {
            pcVar9 = " that you dipped into";
          }
          pline("The %spotion%s %s.",buf,pcVar9,newbuf);
          if (((objects[sVar15].oc_uname == (char *)0x0) && ((uVar12 & 0x20) != 0)) &&
             ((objects[sVar15].field_0x10 & 1) == 0)) {
            poVar11 = &zeroobj;
            poVar19 = &local_98;
            for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
              poVar19->nobj = poVar11->nobj;
              poVar11 = (obj *)((long)poVar11 + ((ulong)bVar21 * -2 + 1) * 8);
              poVar19 = (obj *)((long)poVar19 + (ulong)bVar21 * -0x10 + 8);
            }
            local_98._74_1_ = local_98._74_1_ | 0x20;
            local_98.otyp = local_41c;
            local_98.oclass = '\b';
            docall(&local_98);
          }
        }
        else {
LAB_00213435:
          if (ublindf != (obj *)0x0) {
LAB_0021343a:
            if (ublindf->oartifact == '\x1d') goto LAB_00213469;
          }
          *(uint *)&poVar8->field_0x4a = uVar5 & 0xffffff9f;
        }
        obj_extract_self(poVar8);
        pcVar9 = doname(poVar8);
        hold_another_object(poVar8,"You juggle and drop %s!",pcVar9,(char *)0x0);
LAB_00213656:
        update_inventory();
        return 1;
      }
      sVar15 = (short)*(undefined4 *)&local_430->field_0x4a;
      if (sVar4 == 0x13f) {
        if (-1 < sVar15) {
          iVar7 = local_428->quan;
          pcVar9 = xname(local_428);
          if (iVar7 < 2) {
            pcVar9 = The(pcVar9);
            strcpy(buf,pcVar9);
          }
          else {
            pcVar9 = the(pcVar9);
            sprintf(buf,"One of %s",pcVar9);
          }
          pcVar9 = xname(local_430);
          pcVar9 = the(pcVar9);
          pline("%s forms a coating on %s.",buf,pcVar9);
          *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a | 0x8000;
          goto LAB_00212f65;
        }
        goto LAB_002132e2;
      }
      if (-1 < sVar15) goto LAB_00213131;
      if ((sVar4 != 300) && (sVar4 != 0x131)) {
        if (sVar4 == 0x142) goto LAB_0021313d;
        if (sVar4 != 0x136) goto LAB_002132e2;
      }
      pcVar9 = xname(local_430);
      pcVar9 = the(pcVar9);
      pline("A coating wears off %s.",pcVar9);
      *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a & 0xffff7fff;
    }
  }
  else {
    if ((*(uint *)&local_430->field_0x4a & 1) == 0) {
      if ((*(uint *)&local_430->field_0x4a & 2) != 0) goto LAB_00212d69;
      if (!bVar20) {
        pcVar9 = hcolor("light blue");
        pcVar10 = aobjnam(local_430,"softly glow");
        pcVar18 = strchr("aeiouAEIOU",(int)*pcVar9);
        pcVar13 = "n";
        if (pcVar18 == (char *)0x0) {
          pcVar13 = "";
        }
        pline("%s %s with a%s %s aura.",Your_buf,pcVar10,pcVar13,pcVar9);
      }
      bless(local_430);
    }
    else {
      if (!bVar20) {
        pcVar9 = aobjnam(local_430,"softly glow");
        pcVar10 = hcolor("amber");
        pline("%s %s %s.",Your_buf,pcVar9,pcVar10);
      }
      uncurse(local_430);
    }
LAB_00212f5c:
    *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a | 0x40;
  }
LAB_00212f65:
  poVar8 = local_428;
  if (((objects[local_428->otyp].field_0x10 & 1) == 0) &&
     (objects[local_428->otyp].oc_uname == (char *)0x0)) {
    docall(local_428);
    poVar8 = local_428;
  }
LAB_0021379e:
  useup(poVar8);
  return 1;
}

Assistant:

int dodip(struct obj *potion)
{
	struct obj *obj;
	const char *tmp;
	uchar here;
	char allowall[2] = {ALL_CLASSES, 0};
	char qbuf[QBUFSZ];

	if (potion && !validate_object(potion, beverages, "dip into"))
		return 0;
	
	obj = getobj(allowall, "dip", NULL);
	if (!obj) return 0;

	if (!potion) {
		here = level->locations[u.ux][u.uy].typ;
		/* Is there a fountain to dip into here? */
		if (IS_FOUNTAIN(here)) {
			sprintf(qbuf, "Dip %s into the fountain?",
				safe_qbuf("", sizeof("Dip  into the fountain?"),
					  the(xname(obj)),
					  the(simple_typename(obj->otyp)),
					  "this item"));
			if (yn(qbuf) == 'y') {
				dipfountain(obj);
				return 1;
			}
		} else if (is_pool(level, u.ux,u.uy) || is_swamp(level, u.ux,u.uy)) {
			tmp = waterbody_name(u.ux,u.uy);
			sprintf(qbuf, "Dip %s into the %s?",
				safe_qbuf("",
					  sizeof("Dip  into the pool of water?"),
					  the(xname(obj)),
					  the(simple_typename(obj->otyp)),
					  "this item"),
				tmp);
			if (yn(qbuf) == 'y') {
			    if (Levitation) {
				floating_above(tmp);
			    } else if (u.usteed && !is_swimmer(u.usteed->data) &&
				    P_SKILL(P_RIDING) < P_BASIC) {
				rider_cant_reach(); /* not skilled enough to reach */
			    } else {
				get_wet(obj);
				if (obj->otyp == POT_ACID) useup(obj);
			    }
			    return 1;
			}
		}
		sprintf(qbuf, "dip %s into",
			safe_qbuf("", sizeof("dip  into"),
				  the(xname(obj)),
				  the(simple_typename(obj->otyp)),
				  "this item"));
		potion = getobj(beverages, qbuf, NULL);
	}

	if (!potion) return 0;
	if (potion == obj && potion->quan == 1L) {
		pline("That is a potion bottle, not a Klein bottle!");
		return 0;
	}

	return dip(potion, obj);
}